

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

bool pbrt::HasExtension(string *filename,string *e)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  string ext;
  string filenameExtension;
  long *local_98;
  ulong local_90;
  long local_88 [2];
  string local_78;
  path local_58;
  
  local_98 = local_88;
  pcVar2 = (e->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,pcVar2,pcVar2 + e->_M_string_length)
  ;
  if ((local_90 != 0) && ((char)*local_98 == '.')) {
    std::__cxx11::string::erase((ulong)&local_98,0);
  }
  filesystem::path::path(&local_58,filename);
  filesystem::path::extension_abi_cxx11_(&local_78,&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.m_path);
  plVar4 = local_98;
  if (local_78._M_string_length < local_90) {
    bVar8 = false;
  }
  else if (local_90 == 0) {
    bVar8 = true;
  }
  else {
    lVar7 = -1;
    do {
      cVar1 = local_78._M_dataplus._M_p[lVar7 + local_78._M_string_length];
      iVar5 = tolower((int)*(char *)((long)plVar4 + lVar7 + local_90));
      iVar6 = tolower((int)cVar1);
      bVar8 = iVar5 == iVar6;
      if (!bVar8) break;
      uVar3 = -lVar7;
      lVar7 = lVar7 + -1;
    } while (uVar3 != local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  return bVar8;
}

Assistant:

bool HasExtension(const std::string &filename, const std::string &e) {
    std::string ext = e;
    if (!ext.empty() && ext[0] == '.')
        ext.erase(0, 1);

    std::string filenameExtension = filesystem::path(filename).extension();
    if (ext.size() > filenameExtension.size())
        return false;
    return std::equal(ext.rbegin(), ext.rend(), filenameExtension.rbegin(),
                      [](char a, char b) { return std::tolower(a) == std::tolower(b); });
}